

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmuxgenerator.cpp
# Opt level: O0

string * __thiscall
PortMuxGenerator::extractPortFromString_abi_cxx11_
          (string *__return_storage_ptr__,PortMuxGenerator *this,int muxIndex,int portIndex)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  string local_218;
  string local_1f8 [32];
  string local_1d8;
  string local_1b8;
  int local_194;
  undefined1 local_190 [4];
  int i_2;
  string local_170;
  string local_150 [32];
  string local_130;
  string local_110;
  int local_ec;
  undefined1 local_e8 [4];
  int i_1;
  string local_c8 [32];
  string local_a8;
  string local_88;
  int local_64;
  undefined1 local_60 [4];
  int i;
  int local_2c;
  int local_28;
  int stringBeginIndex;
  int commasCounter;
  int local_1c;
  int portIndex_local;
  int muxIndex_local;
  PortMuxGenerator *this_local;
  string *port;
  
  stringBeginIndex._3_1_ = 0;
  commasCounter = portIndex;
  local_1c = muxIndex;
  _portIndex_local = this;
  this_local = (PortMuxGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28 = 1;
  local_2c = 0;
  if ((commasCounter == 1) && (iVar2 = getMuxNumPorts(this,local_1c), iVar2 == 1)) {
    getMuxPorts_abi_cxx11_((string *)local_60,this,local_1c);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
  }
  else {
    iVar2 = commasCounter;
    if (commasCounter == 1) {
      local_64 = 0;
      while( true ) {
        uVar4 = (ulong)local_64;
        getMuxPorts_abi_cxx11_(&local_88,this,local_1c);
        uVar5 = std::__cxx11::string::size();
        std::__cxx11::string::~string((string *)&local_88);
        if (uVar5 <= uVar4) break;
        getMuxPorts_abi_cxx11_(&local_a8,this,local_1c);
        pcVar6 = (char *)std::__cxx11::string::at((ulong)&local_a8);
        cVar1 = *pcVar6;
        std::__cxx11::string::~string((string *)&local_a8);
        if (cVar1 == ',') {
          getMuxPorts_abi_cxx11_((string *)local_e8,this,local_1c);
          std::__cxx11::string::substr((ulong)local_c8,(ulong)local_e8);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_c8);
          std::__cxx11::string::~string(local_c8);
          std::__cxx11::string::~string((string *)local_e8);
          break;
        }
        local_64 = local_64 + 1;
      }
    }
    else {
      iVar3 = getMuxNumPorts(this,local_1c);
      if (iVar2 == iVar3) {
        local_ec = 0;
        while( true ) {
          uVar4 = (ulong)local_ec;
          getMuxPorts_abi_cxx11_(&local_110,this,local_1c);
          uVar5 = std::__cxx11::string::size();
          std::__cxx11::string::~string((string *)&local_110);
          if (uVar5 <= uVar4) break;
          getMuxPorts_abi_cxx11_(&local_130,this,local_1c);
          pcVar6 = (char *)std::__cxx11::string::at((ulong)&local_130);
          cVar1 = *pcVar6;
          std::__cxx11::string::~string((string *)&local_130);
          if (cVar1 == ',') {
            local_28 = local_28 + 1;
            local_2c = local_ec;
            if (local_28 == commasCounter) {
              getMuxPorts_abi_cxx11_(&local_170,this,local_1c);
              getMuxPorts_abi_cxx11_((string *)local_190,this,local_1c);
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)local_150,(ulong)&local_170);
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_150);
              std::__cxx11::string::~string(local_150);
              std::__cxx11::string::~string((string *)local_190);
              std::__cxx11::string::~string((string *)&local_170);
              break;
            }
          }
          local_ec = local_ec + 1;
        }
      }
      else {
        local_194 = 0;
        while( true ) {
          uVar4 = (ulong)local_194;
          getMuxPorts_abi_cxx11_(&local_1b8,this,local_1c);
          uVar5 = std::__cxx11::string::size();
          std::__cxx11::string::~string((string *)&local_1b8);
          if (uVar5 <= uVar4) break;
          getMuxPorts_abi_cxx11_(&local_1d8,this,local_1c);
          pcVar6 = (char *)std::__cxx11::string::at((ulong)&local_1d8);
          cVar1 = *pcVar6;
          std::__cxx11::string::~string((string *)&local_1d8);
          if (cVar1 == ',') {
            local_28 = local_28 + 1;
            if (local_28 == commasCounter + 1) {
              getMuxPorts_abi_cxx11_(&local_218,this,local_1c);
              std::__cxx11::string::substr((ulong)local_1f8,(ulong)&local_218);
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1f8);
              std::__cxx11::string::~string(local_1f8);
              std::__cxx11::string::~string((string *)&local_218);
              break;
            }
            local_2c = local_194 + 1;
          }
          local_194 = local_194 + 1;
        }
      }
    }
  }
  boost::algorithm::erase_all<std::__cxx11::string,char[2]>
            (__return_storage_ptr__,(char (*) [2])0x13ae75);
  return __return_storage_ptr__;
}

Assistant:

std::string PortMuxGenerator::extractPortFromString(int muxIndex, int portIndex) {
  std::string port;

  int commasCounter = 1;
  int stringBeginIndex = 0;
  if(portIndex == 1 && getMuxNumPorts(muxIndex) == 1) {
    port = getMuxPorts(muxIndex);
  } else if(portIndex == 1) {
    for(int i = 0; i < getMuxPorts(muxIndex).size(); i++) {
      if(getMuxPorts(muxIndex).at(i) == ',') {
        port = getMuxPorts(muxIndex).substr(0, i);
        break;
      }
    }
  } else if(portIndex == getMuxNumPorts(muxIndex)) {
    for(int i = 0; i < getMuxPorts(muxIndex).size(); i++) {
      if(getMuxPorts(muxIndex).at(i) == ',') {
        commasCounter++;
        stringBeginIndex = i;
        if(commasCounter == portIndex) {
          port = getMuxPorts(muxIndex).substr(i + 1, getMuxPorts(muxIndex).size());
          break;
        }
      }
    }
  } else {
    for(int i = 0; i < getMuxPorts(muxIndex).size(); i++) {
      if(getMuxPorts(muxIndex).at(i) == ',') {
        commasCounter++;
        if(commasCounter == (portIndex + 1)) {
          port = getMuxPorts(muxIndex).substr(stringBeginIndex, (i - stringBeginIndex));
          break;
        } else {
          stringBeginIndex = i + 1;
        }
      }
    }
  }

  boost::erase_all(port, " ");

  return port;
}